

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MixedBindingCase::createBuffers(MixedBindingCase *this)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  long lVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int x;
  long lVar11;
  Vec4 *color;
  undefined8 *puVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  allocator_type local_89;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> positionData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorOffsetData;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long lVar6;
  
  iVar4 = (*((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  local_48 = 0x3f80000000000000;
  uStack_40 = 0x3f80000000000000;
  local_58 = 0x3f8000003f800000;
  uStack_50 = 0x3f80000000000000;
  bVar16 = 1 < this->m_case - CASE_INSTANCED_BINDING;
  uVar8 = 400;
  if (!bVar16) {
    uVar8 = 1;
  }
  uVar15 = (uint)bVar16 * 5 + 1;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&positionData,(ulong)(uVar8 * 6),(allocator_type *)&colorOffsetData);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&colorOffsetData,(ulong)(uVar15 * 800),&local_89);
  for (lVar7 = 0; (ulong)uVar8 * 0x60 - lVar7 != 0; lVar7 = lVar7 + 0x60) {
    puVar12 = (undefined8 *)
              ((long)(positionData.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar7);
    *puVar12 = 0;
    puVar12[1] = 0x3f80000000000000;
    puVar12 = (undefined8 *)
              ((long)positionData.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar7);
    *puVar12 = 0x3dcccccd00000000;
    puVar12[1] = 0x3f80000000000000;
    puVar1 = (undefined4 *)
             ((long)positionData.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar7);
    *puVar1 = 0x3dcccccd;
    puVar1[1] = 0x3dcccccd;
    puVar1[2] = 0;
    puVar1[3] = 0x3f800000;
    puVar12 = (undefined8 *)
              ((long)positionData.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar7);
    *puVar12 = 0;
    puVar12[1] = 0x3f80000000000000;
    puVar1 = (undefined4 *)
             ((long)positionData.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar7);
    *puVar1 = 0x3dcccccd;
    puVar1[1] = 0x3dcccccd;
    puVar1[2] = 0;
    puVar1[3] = 0x3f800000;
    puVar1 = (undefined4 *)
             ((long)positionData.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[5].m_data + lVar7);
    *puVar1 = 0x3dcccccd;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0x3f800000;
  }
  lVar7 = 0;
  for (lVar9 = 0; lVar9 != 0x14; lVar9 = lVar9 + 1) {
    fVar17 = (float)(int)lVar9 / 20.0;
    lVar10 = lVar7;
    for (lVar11 = 0; lVar11 != 0x14; lVar11 = lVar11 + 1) {
      puVar12 = &local_58;
      if (((int)lVar11 + (int)lVar9 & 1U) == 0) {
        puVar12 = &local_48;
      }
      fVar18 = (float)(int)lVar11 / 20.0;
      lVar13 = lVar10;
      uVar14 = (ulong)uVar15;
      while (bVar16 = uVar14 != 0, uVar14 = uVar14 - 1, bVar16) {
        uVar3 = puVar12[1];
        puVar2 = (undefined8 *)
                 ((long)(colorOffsetData.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13);
        *puVar2 = *puVar12;
        puVar2[1] = uVar3;
        *(float *)((long)colorOffsetData.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar13) =
             fVar18 + fVar18 + -1.0;
        *(float *)((long)colorOffsetData.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar13 + 4) =
             fVar17 + fVar17 + -1.0;
        *(undefined8 *)
         ((long)colorOffsetData.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[1].m_data + lVar13 + 8) = 0;
        lVar13 = lVar13 + 0x20;
      }
      lVar10 = lVar10 + (ulong)(uVar15 * 0x20);
    }
    lVar7 = lVar7 + (ulong)uVar15 * 0x280;
  }
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_posBuffer);
  (**(code **)(lVar6 + 0x40))(0x8892,this->m_posBuffer);
  (**(code **)(lVar6 + 0x150))
            (0x8892,(long)((int)positionData.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (int)positionData.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
             positionData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"upload position data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x413);
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_colorOffsetBuffer);
  (**(code **)(lVar6 + 0x40))(0x8892,this->m_colorOffsetBuffer);
  (**(code **)(lVar6 + 0x150))
            (0x8892,(long)((int)colorOffsetData.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (int)colorOffsetData.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
             colorOffsetData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"upload position data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x418);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&colorOffsetData.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&positionData.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return;
}

Assistant:

void MixedBindingCase::createBuffers (void)
{
	const glw::Functions&	gl								= m_context.getRenderContext().getFunctions();
	const tcu::Vec4			green							= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4			yellow							= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);

	// draw grid. In instanced mode, each cell is an instance
	const bool				instanced						= (m_case == CASE_INSTANCED_BINDING) || (m_case == CASE_INSTANCED_ATTRIB);
	const int				numCells						= GRID_SIZE*GRID_SIZE;
	const int				numPositionCells				= (instanced) ? (1) : (numCells);
	const int				numPositionElements				= 6 * numPositionCells;
	const int				numInstanceElementsPerCell		= (instanced) ? (1) : (6);
	const int				numColorOffsetElements			= numInstanceElementsPerCell * numCells;

	std::vector<tcu::Vec4>	positionData					(numPositionElements);
	std::vector<tcu::Vec4>	colorOffsetData					(2 * numColorOffsetElements);

	// positions

	for (int primNdx = 0; primNdx < numPositionCells; ++primNdx)
	{
		positionData[primNdx*6 + 0] =  tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		positionData[primNdx*6 + 1] =  tcu::Vec4(0.0f,				2.0f / GRID_SIZE,	0.0f, 1.0f);
		positionData[primNdx*6 + 2] =  tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		positionData[primNdx*6 + 3] =  tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		positionData[primNdx*6 + 4] =  tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		positionData[primNdx*6 + 5] =  tcu::Vec4(2.0f / GRID_SIZE,	0.0f,				0.0f, 1.0f);
	}

	// color & offset

	for (int y = 0; y < GRID_SIZE; ++y)
	for (int x = 0; x < GRID_SIZE; ++x)
	{
		for (int v = 0; v < numInstanceElementsPerCell; ++v)
		{
			const tcu::Vec4& color = ((x + y) % 2 == 0) ? (green) : (yellow);

			colorOffsetData[((y * GRID_SIZE + x) * numInstanceElementsPerCell + v) * 2 + 0] = color;
			colorOffsetData[((y * GRID_SIZE + x) * numInstanceElementsPerCell + v) * 2 + 1] = tcu::Vec4(float(x) / float(GRID_SIZE) * 2.0f - 1.0f, float(y) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 0.0f);
		}
	}

	// upload vertex data

	gl.genBuffers(1, &m_posBuffer);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_posBuffer);
	gl.bufferData(GL_ARRAY_BUFFER, (int)(positionData.size() * sizeof(tcu::Vec4)), positionData[0].getPtr(), GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "upload position data");

	gl.genBuffers(1, &m_colorOffsetBuffer);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_colorOffsetBuffer);
	gl.bufferData(GL_ARRAY_BUFFER, (int)(colorOffsetData.size() * sizeof(tcu::Vec4)), colorOffsetData[0].getPtr(), GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "upload position data");
}